

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_515e::FloatxNanInfTest_DIV_2_47_simple_Test::TestBody
          (FloatxNanInfTest_DIV_2_47_simple_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  fp_t dynamicnan;
  fp_t zero;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  T c;
  T b;
  T a;
  double *in_stack_fffffffffffffe88;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *in_stack_fffffffffffffe90;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int line;
  double *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Type in_stack_fffffffffffffebc;
  AssertHelper *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  AssertionResult local_100;
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_b0 [3];
  undefined8 local_80;
  double local_78;
  AssertionResult local_70;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> local_60;
  undefined4 local_4c;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> local_48;
  undefined8 local_38;
  flexfloat local_30 [16];
  undefined8 local_20;
  flexfloat local_18 [24];
  
  local_20 = 0xbcefe8f0efb4b6c6;
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'/'>::flexfloat<double>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_38 = 0xbcc555554351fe67;
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'/'>::flexfloat<double>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_4c = 0;
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'/'>::flexfloat<int>
            (in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
  operator/(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'/'>::operator=(&local_48,&local_60);
  local_78 = flexfloat::operator_cast_to_double(local_18);
  local_80 = 0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(double *)in_stack_fffffffffffffe98
             ,(double *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffeb0 =
         (double *)testing::AssertionResult::failure_message((AssertionResult *)0x177361);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x1773be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17742c);
  flexfloat::operator_cast_to_double(local_30);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(double *)in_stack_fffffffffffffe98
             ,(double *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffea8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1774bf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x17751c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17758a);
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,flexfloat<(unsigned_char)2,(unsigned_char)47>>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90);
  line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffea0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1775f2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,line,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x17764f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1776bd);
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,double>
            (in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    testing::AssertionResult::failure_message((AssertionResult *)0x17772c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,line,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x17777a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1777df);
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)47>,double>
            (in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)___> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffec8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x177860)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,line,in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1778ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x177910);
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_2_47_simple)
{
    using T = flexfloat<2, 47>;
    T a = -(
        7.105427e-15 / 2 -
        1e-17);  // a bit smaller than half of the smallest subnormal in <2,47>
    T b = -(7.105427e-15 / 12.0);
    T c = 0;
    c = a / b;
    EXPECT_EQ(fp_t(a), 0.00000000000000000000);
    EXPECT_EQ(fp_t(b), 0.00000000000000000000);
    EXPECT_NE(c, c);    // holds only for NANs
    EXPECT_NE(c, nan);  // holds only for NANs

    fp_t zero = 0;
    fp_t dynamicnan = zero / zero;

    EXPECT_NE(c, dynamicnan);  // holds only for NANs
}